

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

void __thiscall
Centaurus::CATNMachine<wchar_t>::import_atn_node
          (CATNMachine<wchar_t> *this,ATNMachine<wchar_t> *atn,int index,int origin,
          vector<int,_std::allocator<int>_> *node_map,int tag)

{
  pointer pAVar1;
  pointer pAVar2;
  pointer piVar3;
  pointer pAVar4;
  bool local_89;
  vector<int,_std::allocator<int>_> *local_88;
  int local_7c;
  CharClass<wchar_t> local_78;
  ATNMachine<wchar_t> *local_58;
  initializer_list<wchar_t> local_50;
  wchar_t local_40 [4];
  
  pAVar1 = (atn->m_nodes).
           super__Vector_base<Centaurus::ATNNode<wchar_t>,_std::allocator<Centaurus::ATNNode<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (node_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [index] = (int)((ulong)((long)(this->m_nodes).
                                super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_nodes).
                               super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
  local_88 = node_map;
  local_58 = atn;
  switch(pAVar1[index].m_type) {
  case Blank:
    local_78._vptr_CharClass = (_func_int **)&PTR__CharClass_001a04f0;
    local_78.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.m_ranges.
    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    origin = add_node(this,&local_78,origin,tag);
    local_78._vptr_CharClass = (_func_int **)&PTR__CharClass_001a04f0;
    std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
              (&local_78.m_ranges);
    break;
  case Nonterminal:
    origin = import_nonterminal(this,&pAVar1[index].m_invoke,origin,tag);
    break;
  case LiteralTerminal:
    origin = import_literal_terminal(this,&pAVar1[index].m_literal,origin,tag);
    break;
  case RegularTerminal:
    origin = import_regular_terminal(this,&pAVar1[index].m_nfa,origin,tag);
    break;
  case WhiteSpace:
    local_50._M_array = local_40;
    builtin_wcsncpy(local_40,L" \t\r\n",4);
    local_50._M_len = 4;
    CharClass<wchar_t>::CharClass(&local_78,&local_50);
    origin = import_whitespace(this,&local_78,origin,tag);
    local_78._vptr_CharClass = (_func_int **)&PTR__CharClass_001a04f0;
    std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
              (&local_78.m_ranges);
  }
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>.
  _M_impl.super__Vector_impl_data._M_start[origin].m_source = index;
  pAVar4 = pAVar1[index].m_transitions.
           super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar2 = *(pointer *)
            ((long)&pAVar1[index].m_transitions.
                    super__Vector_base<Centaurus::ATNTransition<wchar_t>,_std::allocator<Centaurus::ATNTransition<wchar_t>_>_>
                    ._M_impl + 8);
  if (pAVar4 != pAVar2) {
    local_7c = origin;
    do {
      piVar3 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (piVar3[pAVar4->m_dest] < 0) {
        import_atn_node(this,local_58,pAVar4->m_dest,local_7c,local_88,pAVar4->m_tag);
      }
      else {
        local_78._vptr_CharClass = (_func_int **)&PTR__CharClass_001a04f0;
        local_78.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.m_ranges.
        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_50._M_array = (iterator)CONCAT44(local_50._M_array._4_4_,piVar3[pAVar4->m_dest]);
        local_40[0] = pAVar4->m_tag;
        local_89 = false;
        std::
        vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
        ::emplace_back<Centaurus::CharClass<wchar_t>const&,int&,bool,int&>
                  ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
                    *)&(this->m_nodes).
                       super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[origin].m_transitions,&local_78,
                   (int *)&local_50,&local_89,local_40);
        local_78._vptr_CharClass = (_func_int **)&PTR__CharClass_001a04f0;
        std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
                  (&local_78.m_ranges);
      }
      pAVar4 = pAVar4 + 1;
    } while (pAVar4 != pAVar2);
  }
  return;
}

Assistant:

void import_atn_node(const ATNMachine<TCHAR>& atn, int index, int origin, std::vector<int>& node_map, int tag)
    {
        const ATNNode<TCHAR>& node = atn.get_node(index);

        node_map[index] = m_nodes.size();

        switch (node.type())
        {
        case ATNNodeType::Blank:
            origin = add_node(CharClass<TCHAR>(), origin, tag);
            break;
        case ATNNodeType::LiteralTerminal:
            origin = import_literal_terminal(node.get_literal(), origin, tag);
            break;
        case ATNNodeType::RegularTerminal:
            origin = import_regular_terminal(node.get_nfa(), origin, tag);
            break;
        case ATNNodeType::Nonterminal:
            origin = import_nonterminal(node.get_submachine(), origin, tag);
            break;
        case ATNNodeType::WhiteSpace:
            origin = import_whitespace(CharClass<TCHAR>({u' ', u'\t', u'\r', u'\n'}), origin, tag);
            break;
        }

        m_nodes[origin].set_source(index);

        for (const auto& tr : node.get_transitions())
        {
            if (node_map[tr.dest()] < 0)
                import_atn_node(atn, tr.dest(), origin, node_map, tr.tag());
            else
                m_nodes[origin].add_transition(CharClass<TCHAR>(), node_map[tr.dest()], tr.tag());
        }
    }